

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Condition.cpp
# Opt level: O0

bool __thiscall
AI::Condition::isTrue
          (Condition *this,WorldState *state,Task *task,
          vector<AI::SatisfiablePredicate,_std::allocator<AI::SatisfiablePredicate>_>
          *satisfiablePredicates,bool isMerged)

{
  bool bVar1;
  pointer ppVar2;
  pointer ppVar3;
  reference pSVar4;
  const_iterator __first;
  const_iterator __last;
  pointer pSVar5;
  pointer ppVar6;
  pointer ppVar7;
  reference pCVar8;
  pointer ppVar9;
  _Rb_tree_const_iterator<std::pair<const_ConsumableFact,_AI::FactVector>_> local_158;
  const_iterator it_4;
  iterator iStack_148;
  ConsumableFact consumable_2;
  iterator __end1_4;
  iterator __begin1_4;
  vector<ConsumableFact,_std::allocator<ConsumableFact>_> *__range1_4;
  const_iterator it_3;
  iterator iStack_120;
  ConsumableFact consumable_1;
  iterator __end1_3;
  iterator __begin1_3;
  vector<ConsumableFact,_std::allocator<ConsumableFact>_> *__range1_3;
  const_iterator it_2;
  iterator iStack_f8;
  ConsumableFact consumable;
  iterator __end1_2;
  iterator __begin1_2;
  vector<ConsumableFact,_std::allocator<ConsumableFact>_> *__range1_2;
  __normal_iterator<const_AI::SatisfiablePredicate_*,_std::vector<AI::SatisfiablePredicate,_std::allocator<AI::SatisfiablePredicate>_>_>
  local_c8;
  __normal_iterator<const_AI::SatisfiablePredicate_*,_std::vector<AI::SatisfiablePredicate,_std::allocator<AI::SatisfiablePredicate>_>_>
  *local_c0;
  __normal_iterator<const_AI::SatisfiablePredicate_*,_std::vector<AI::SatisfiablePredicate,_std::allocator<AI::SatisfiablePredicate>_>_>
  *pred;
  SatisfiablePredicateParams satisfiable;
  iterator __end2;
  iterator __begin2;
  vector<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_> *__range2;
  _Self local_90;
  const_iterator it_1;
  RequiredValue *requiredValue;
  iterator __end1_1;
  iterator __begin1_1;
  vector<AI::RequiredValue,_std::allocator<AI::RequiredValue>_> *__range1_1;
  _Self local_60;
  const_iterator it;
  RequiredFlag *requiredFlag;
  iterator __end1;
  iterator __begin1;
  vector<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_> *__range1;
  bool isMerged_local;
  vector<AI::SatisfiablePredicate,_std::allocator<AI::SatisfiablePredicate>_>
  *satisfiablePredicates_local;
  Task *task_local;
  WorldState *state_local;
  Condition *this_local;
  
  __end1 = std::vector<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>::begin
                     (&this->requiredFlags);
  requiredFlag = (RequiredFlag *)
                 std::vector<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>::end
                           (&this->requiredFlags);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<AI::RequiredFlag_*,_std::vector<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>_>
                                *)&requiredFlag);
    if (!bVar1) {
      __end1_1 = std::vector<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>::begin
                           (&this->requiredValues);
      requiredValue =
           (RequiredValue *)
           std::vector<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>::end
                     (&this->requiredValues);
      do {
        bVar1 = __gnu_cxx::operator!=
                          (&__end1_1,
                           (__normal_iterator<AI::RequiredValue_*,_std::vector<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>_>
                            *)&requiredValue);
        if (!bVar1) {
          if (!isMerged) {
            __end2 = std::
                     vector<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>
                     ::begin(&this->satisfiedPredicates);
            satisfiable = (SatisfiablePredicateParams)
                          std::
                          vector<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>
                          ::end(&this->satisfiedPredicates);
            while (bVar1 = __gnu_cxx::operator!=
                                     (&__end2,(__normal_iterator<AI::SatisfiablePredicateParams_*,_std::vector<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>_>
                                               *)&satisfiable), bVar1) {
              pSVar4 = __gnu_cxx::
                       __normal_iterator<AI::SatisfiablePredicateParams_*,_std::vector<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>_>
                       ::operator*(&__end2);
              pred = *(__normal_iterator<const_AI::SatisfiablePredicate_*,_std::vector<AI::SatisfiablePredicate,_std::allocator<AI::SatisfiablePredicate>_>_>
                       **)pSVar4;
              __first = std::
                        begin<std::vector<AI::SatisfiablePredicate,std::allocator<AI::SatisfiablePredicate>>>
                                  (satisfiablePredicates);
              __last = std::
                       end<std::vector<AI::SatisfiablePredicate,std::allocator<AI::SatisfiablePredicate>>>
                                 (satisfiablePredicates);
              local_c8 = std::
                         find_if<__gnu_cxx::__normal_iterator<AI::SatisfiablePredicate_const*,std::vector<AI::SatisfiablePredicate,std::allocator<AI::SatisfiablePredicate>>>,AI::Condition::isTrue(AI::WorldState_const&,AI::Task_const&,std::vector<AI::SatisfiablePredicate,std::allocator<AI::SatisfiablePredicate>>const&,bool)::__0>
                                   (__first._M_current,__last._M_current,
                                    (anon_class_8_1_c5eeee8d_for__M_pred)pred);
              local_c0 = &local_c8;
              pSVar5 = __gnu_cxx::
                       __normal_iterator<const_AI::SatisfiablePredicate_*,_std::vector<AI::SatisfiablePredicate,_std::allocator<AI::SatisfiablePredicate>_>_>
                       ::operator->(local_c0);
              bVar1 = std::function<bool_(const_AI::WorldState_&,_const_AI::Task_&,_int)>::
                      operator()(&pSVar5->func,state,task,pred._4_4_);
              if (!bVar1) {
                return false;
              }
              __gnu_cxx::
              __normal_iterator<AI::SatisfiablePredicateParams_*,_std::vector<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>_>
              ::operator++(&__end2);
            }
          }
          __end1_2 = std::vector<ConsumableFact,_std::allocator<ConsumableFact>_>::begin
                               (&this->consumableFlags);
          iStack_f8 = std::vector<ConsumableFact,_std::allocator<ConsumableFact>_>::end
                                (&this->consumableFlags);
          while (bVar1 = __gnu_cxx::operator!=(&__end1_2,&stack0xffffffffffffff08), bVar1) {
            pCVar8 = __gnu_cxx::
                     __normal_iterator<ConsumableFact_*,_std::vector<ConsumableFact,_std::allocator<ConsumableFact>_>_>
                     ::operator*(&__end1_2);
            it_2._M_node._4_4_ = *pCVar8;
            __range1_3 = (vector<ConsumableFact,_std::allocator<ConsumableFact>_> *)
                         std::
                         map<ConsumableFact,_AI::FactFlag,_std::less<ConsumableFact>,_std::allocator<std::pair<const_ConsumableFact,_AI::FactFlag>_>_>
                         ::find(&(state->facts).flags,(key_type *)((long)&it_2._M_node + 4));
            ppVar6 = std::_Rb_tree_const_iterator<std::pair<const_ConsumableFact,_AI::FactFlag>_>::
                     operator->((_Rb_tree_const_iterator<std::pair<const_ConsumableFact,_AI::FactFlag>_>
                                 *)&__range1_3);
            if (((ppVar6->second).consumed & 1U) != 0) {
              return false;
            }
            __gnu_cxx::
            __normal_iterator<ConsumableFact_*,_std::vector<ConsumableFact,_std::allocator<ConsumableFact>_>_>
            ::operator++(&__end1_2);
          }
          __end1_3 = std::vector<ConsumableFact,_std::allocator<ConsumableFact>_>::begin
                               (&this->consumableValues);
          iStack_120 = std::vector<ConsumableFact,_std::allocator<ConsumableFact>_>::end
                                 (&this->consumableValues);
          while (bVar1 = __gnu_cxx::operator!=(&__end1_3,&stack0xfffffffffffffee0), bVar1) {
            pCVar8 = __gnu_cxx::
                     __normal_iterator<ConsumableFact_*,_std::vector<ConsumableFact,_std::allocator<ConsumableFact>_>_>
                     ::operator*(&__end1_3);
            it_3._M_node._4_4_ = *pCVar8;
            __range1_4 = (vector<ConsumableFact,_std::allocator<ConsumableFact>_> *)
                         std::
                         map<ConsumableFact,_AI::FactValue,_std::less<ConsumableFact>,_std::allocator<std::pair<const_ConsumableFact,_AI::FactValue>_>_>
                         ::find(&(state->facts).values,(key_type *)((long)&it_3._M_node + 4));
            ppVar7 = std::_Rb_tree_const_iterator<std::pair<const_ConsumableFact,_AI::FactValue>_>::
                     operator->((_Rb_tree_const_iterator<std::pair<const_ConsumableFact,_AI::FactValue>_>
                                 *)&__range1_4);
            if (((ppVar7->second).consumed & 1U) != 0) {
              return false;
            }
            __gnu_cxx::
            __normal_iterator<ConsumableFact_*,_std::vector<ConsumableFact,_std::allocator<ConsumableFact>_>_>
            ::operator++(&__end1_3);
          }
          __end1_4 = std::vector<ConsumableFact,_std::allocator<ConsumableFact>_>::begin
                               (&this->consumableVectors);
          iStack_148 = std::vector<ConsumableFact,_std::allocator<ConsumableFact>_>::end
                                 (&this->consumableVectors);
          while( true ) {
            bVar1 = __gnu_cxx::operator!=(&__end1_4,&stack0xfffffffffffffeb8);
            if (!bVar1) {
              return true;
            }
            pCVar8 = __gnu_cxx::
                     __normal_iterator<ConsumableFact_*,_std::vector<ConsumableFact,_std::allocator<ConsumableFact>_>_>
                     ::operator*(&__end1_4);
            it_4._M_node._4_4_ = *pCVar8;
            local_158._M_node =
                 (_Base_ptr)
                 std::
                 map<ConsumableFact,_AI::FactVector,_std::less<ConsumableFact>,_std::allocator<std::pair<const_ConsumableFact,_AI::FactVector>_>_>
                 ::find(&(state->facts).vectors,(key_type *)((long)&it_4._M_node + 4));
            ppVar9 = std::_Rb_tree_const_iterator<std::pair<const_ConsumableFact,_AI::FactVector>_>
                     ::operator->(&local_158);
            if (((ppVar9->second).consumed & 1U) != 0) break;
            __gnu_cxx::
            __normal_iterator<ConsumableFact_*,_std::vector<ConsumableFact,_std::allocator<ConsumableFact>_>_>
            ::operator++(&__end1_4);
          }
          return false;
        }
        it_1._M_node = (_Base_ptr)
                       __gnu_cxx::
                       __normal_iterator<AI::RequiredValue_*,_std::vector<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>_>
                       ::operator*(&__end1_1);
        local_90._M_node =
             (_Base_ptr)
             std::
             map<WorldStateIdentifier,_float,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
             ::find(&(state->current).values,(key_type *)it_1._M_node);
        __range2 = (vector<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>
                    *)std::
                      end<std::map<WorldStateIdentifier,float,std::less<WorldStateIdentifier>,std::allocator<std::pair<WorldStateIdentifier_const,float>>>>
                                (&(state->current).values);
        bVar1 = std::operator==(&local_90,(_Self *)&__range2);
        if (bVar1) {
          log<char_const*,char_const*>("[Condition] ","ERROR: flag missing");
        }
        switch(*(undefined4 *)&(it_1._M_node)->field_0x4) {
        case 0:
          ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_WorldStateIdentifier,_float>_>::
                   operator->(&local_90);
          if (*(float *)&(it_1._M_node)->_M_parent <= ppVar3->second) {
            return false;
          }
          break;
        case 1:
          ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_WorldStateIdentifier,_float>_>::
                   operator->(&local_90);
          if (*(float *)&(it_1._M_node)->_M_parent <= ppVar3->second &&
              ppVar3->second != *(float *)&(it_1._M_node)->_M_parent) {
            return false;
          }
          break;
        case 2:
          ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_WorldStateIdentifier,_float>_>::
                   operator->(&local_90);
          if ((ppVar3->second != *(float *)&(it_1._M_node)->_M_parent) ||
             (NAN(ppVar3->second) || NAN(*(float *)&(it_1._M_node)->_M_parent))) {
            return false;
          }
          break;
        case 3:
          ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_WorldStateIdentifier,_float>_>::
                   operator->(&local_90);
          if ((ppVar3->second == *(float *)&(it_1._M_node)->_M_parent) &&
             (!NAN(ppVar3->second) && !NAN(*(float *)&(it_1._M_node)->_M_parent))) {
            return false;
          }
          break;
        case 4:
          ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_WorldStateIdentifier,_float>_>::
                   operator->(&local_90);
          if (ppVar3->second <= *(float *)&(it_1._M_node)->_M_parent) {
            return false;
          }
          break;
        case 5:
          ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_WorldStateIdentifier,_float>_>::
                   operator->(&local_90);
          if (ppVar3->second < *(float *)&(it_1._M_node)->_M_parent) {
            return false;
          }
        }
        __gnu_cxx::
        __normal_iterator<AI::RequiredValue_*,_std::vector<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>_>
        ::operator++(&__end1_1);
      } while( true );
    }
    it._M_node = (_Base_ptr)
                 __gnu_cxx::
                 __normal_iterator<AI::RequiredFlag_*,_std::vector<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>_>
                 ::operator*(&__end1);
    local_60._M_node =
         (_Base_ptr)
         std::
         map<WorldStateIdentifier,_bool,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
         ::find((map<WorldStateIdentifier,_bool,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
                 *)state,(key_type *)it._M_node);
    __range1_1 = (vector<AI::RequiredValue,_std::allocator<AI::RequiredValue>_> *)
                 std::
                 end<std::map<WorldStateIdentifier,bool,std::less<WorldStateIdentifier>,std::allocator<std::pair<WorldStateIdentifier_const,bool>>>>
                           ((map<WorldStateIdentifier,_bool,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
                             *)state);
    bVar1 = std::operator==(&local_60,(_Self *)&__range1_1);
    if (bVar1) {
      log<char_const*,char_const*>("[Condition] ","ERROR: flag missing");
    }
    ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_WorldStateIdentifier,_bool>_>::operator->
                       (&local_60);
    if ((ppVar2->second & 1U) != ((it._M_node)->field_0x4 & 1)) break;
    __gnu_cxx::
    __normal_iterator<AI::RequiredFlag_*,_std::vector<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>_>
    ::operator++(&__end1);
  }
  return false;
}

Assistant:

bool Condition::isTrue(const WorldState& state, const Task& task, const std::vector<SatisfiablePredicate>& satisfiablePredicates, bool isMerged)
	{
		for (auto& requiredFlag : requiredFlags)
		{
			auto it = state.current.flags.find(requiredFlag.id);

			if (it == end(state.current.flags))
			{
				log("[Condition] ", "ERROR: flag missing");
			}

			if (it->second != requiredFlag.flag)
				return false;
		}

		for (auto& requiredValue : requiredValues)
		{
			auto it = state.current.values.find(requiredValue.id);

			if (it == end(state.current.values))
			{
				log("[Condition] ", "ERROR: flag missing");
			}

			switch (requiredValue.op)
			{
				case ConditionOp::LessThan
					:
				{					
					if (it->second >= requiredValue.value)
						return false;

					break;
				}
				case ConditionOp::LessEqual
					:
				{					
					if (it->second > requiredValue.value)
						return false;

					break;
				}
				case ConditionOp::EqualTo
					:
				{					
					if (it->second != requiredValue.value)
						return false;
					break;
				}
				case ConditionOp::NotEqualTo
					:
				{
					if (it->second == requiredValue.value)
						return false;
					break;
				}
				case ConditionOp::GreaterThan
					:
				{					
					if (it->second <= requiredValue.value)
						return false;

					break;
				}
				case ConditionOp::GreaterEqual
					:
				{					
					if (it->second < requiredValue.value)
						return false;

					break;
				}				
			}
		}		

		if (!isMerged)
		{
			for (auto satisfiable : satisfiedPredicates)
			{			
				const auto& pred = std::find_if(begin(satisfiablePredicates), end(satisfiablePredicates), 
					[satisfiable](const auto& sp) {return sp.identifier == satisfiable.identifier;});
				
				if (!pred->func(state, task, satisfiable.index))
				{
					return false;
				}
			}
		}

		for (auto consumable : consumableFlags)
		{
			auto it = state.facts.flags.find(consumable);

			if (it->second.consumed)
			{
				return false;
			}
		}

		for (auto consumable : consumableValues)
		{
			auto it = state.facts.values.find(consumable);

			if (it->second.consumed)
			{
				return false;
			}
		}

		for (auto consumable : consumableVectors)
		{
			auto it = state.facts.vectors.find(consumable);

			if (it->second.consumed)
			{
				return false;
			}
		}

		return true;
	}